

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall
CVmObjBigNum::getp_round_dec(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  ushort uVar2;
  ushort *puVar3;
  int iVar4;
  int iVar5;
  ushort *in_RAX;
  char *new_ext;
  ushort *local_38;
  
  puVar3 = (ushort *)(this->super_CVmObject).ext_;
  uVar1 = puVar3[1];
  uVar2 = *puVar3;
  local_38 = in_RAX;
  if (getp_round_dec(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_round_dec();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_round_dec::desc);
  if (iVar4 == 0) {
    iVar4 = CVmBif::pop_int_val();
    iVar5 = setup_getp_retval(this,self,retval,(char **)&local_38,(ulong)uVar2);
    if (iVar5 == 0) {
      memcpy(local_38,(this->super_CVmObject).ext_,(ulong)(uVar2 + 1 >> 1) + 5);
      iVar4 = iVar4 + (short)uVar1;
      if (iVar4 < 0) {
        local_38[1] = 1;
        *(byte *)(local_38 + 2) = (byte)local_38[2] & 0xf0 | 8;
        memset((void *)((long)local_38 + 5),0,(ulong)(*local_38 + 1 >> 1));
      }
      else if (iVar4 < (int)(uint)uVar2) {
        round_to((char *)local_38,iVar4);
        normalize((char *)local_38);
      }
      sp_ = sp_ + -1;
    }
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_round_dec(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    int places;
    char *new_ext;
    int post_idx;
    int exp = get_exp(ext_);
    size_t prec = get_prec(ext_);
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the number of digits for rounding */
    places = CVmBif::pop_int_val(vmg0_);

    /* set up the return value */
    if (setup_getp_retval(vmg_ self, retval, &new_ext, prec))
        return TRUE;

    /* make a copy in the new object */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* 
     *   Determine if the first digit we're lopping off is actually
     *   represented in the number or not.  This digit position is the
     *   exponent plus the number of decimal places after the decimal to
     *   keep - if this value is at least zero and less than the
     *   precision, it's part of the number.  
     */
    post_idx = places + exp;
    if (post_idx < 0)
    {
        /* 
         *   the digit after the last digit to keep is actually before the
         *   beginning of the number, so the result of the rounding is
         *   simply zero 
         */
        set_zero(new_ext);
    }
    else if (post_idx >= (int)prec)
    {
        /* 
         *   the digit after the last digit to keep is past the end of the
         *   represented digits, so rounding has no effect at all - we'll
         *   simply return the same number 
         */
    }
    else
    {
        /* round it */
        round_to(new_ext, post_idx);

        /* normalize the result */
        normalize(new_ext);
    }

    /* remove my self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}